

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall glcts::anon_unknown_0::SubRoutineLocArraysMix::Run(SubRoutineLocArraysMix *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  _Vector_base<int,_std::allocator<int>_> local_398;
  vector<int,_std::allocator<int>_> arraySizesSegmented;
  SubroutineFunctionSet functions_st0;
  SubroutineFunctionSet functions_st1;
  SubroutineUniform local_2f8;
  UniformType local_190;
  UniformValue local_100;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st0,generator,2);
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st1,generator,2);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SubroutineUniform::SubroutineUniform
            (&local_2f8,generator,&functions_st0,(Loc)ZEXT812(1),2,(DefOccurence)0x0,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,&local_2f8);
  SubroutineUniform::~SubroutineUniform(&local_2f8);
  std::vector<int,_std::allocator<int>_>::vector
            (&arraySizesSegmented,2,(allocator_type *)&local_2f8);
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[0] = 2;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 3;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_398,&arraySizesSegmented);
  SubroutineFunctionSet::SubroutineFunctionSet(&local_2f8.functions,&functions_st0);
  local_2f8.location.super_LayoutSpecifierBase.val = 3;
  local_2f8.location.super_LayoutSpecifierBase.numSys = Dec;
  local_2f8.location.super_LayoutSpecifierBase.occurence.occurence = ALL_SH;
  local_2f8.defOccurence.occurence = ALL_SH;
  local_2f8.used = true;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_2f8.arraySizesSegmented,(vector<int,_std::allocator<int>_> *)&local_398);
  local_2f8.isArray = true;
  UniformType::UniformType((UniformType *)&local_100,0x1405,0);
  UniformValue::UniformValue(&local_2f8.embeddedUIntUniform,(UniformType *)&local_100,generator);
  UniformType::~UniformType((UniformType *)&local_100);
  local_2f8.name._M_dataplus._M_p = (pointer)&local_2f8.name.field_2;
  local_2f8.name._M_string_length = 0;
  local_2f8.name.field_2._M_local_buf[0] = '\0';
  local_2f8.arraySize = 1;
  lVar1 = 0;
  while( true ) {
    if ((long)local_2f8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_2f8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2 == lVar1) {
      UniformType::UniformType(&local_190,0x1405,local_2f8.arraySize);
      UniformValue::UniformValue(&local_100,&local_190,generator);
      UniformValue::operator=(&local_2f8.embeddedUIntUniform,&local_100);
      UniformValue::~UniformValue(&local_100);
      UniformType::~UniformType(&local_190);
      for (lVar1 = 0; lVar1 < local_2f8.arraySize; lVar1 = lVar1 + 1) {
        local_2f8.embeddedUIntUniform.uValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] =
             (int)((ulong)(long)local_2f8.embeddedUIntUniform.uValues.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar1] %
                  (ulong)(((long)local_2f8.functions.fn.
                                 super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_2f8.functions.fn.
                                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x108));
      }
      std::
      vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      ::push_back(&subroutineUniforms,&local_2f8);
      SubroutineUniform::~SubroutineUniform(&local_2f8);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_398);
      SubroutineUniform::SubroutineUniform
                (&local_2f8,generator,&functions_st1,(Loc)ZEXT812(9),0,(DefOccurence)0x0,true);
      std::
      vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      ::push_back(&subroutineUniforms,&local_2f8);
      SubroutineUniform::~SubroutineUniform(&local_2f8);
      lVar1 = ExplicitUniformLocationCaseBase::doRun
                        (&this->super_ExplicitUniformLocationCaseBase,&subroutineUniforms);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      ::~vector(&subroutineUniforms);
      SubroutineFunctionSet::~SubroutineFunctionSet(&functions_st1);
      SubroutineFunctionSet::~SubroutineFunctionSet(&functions_st0);
      return lVar1;
    }
    if (local_2f8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar1] < 1) break;
    local_2f8.arraySize =
         local_2f8.arraySize *
         local_2f8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar1];
    lVar1 = lVar1 + 1;
  }
  __assert_fail("arraySizesSegmented[i] > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x34e,
                "glcts::(anonymous namespace)::SubroutineUniform::SubroutineUniform(UniformValueGenerator &, SubroutineFunctionSet &, Loc, std::vector<int>, DefOccurence, bool)"
               );
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		//subroutine vec4 st1(float param);
		//subroutine(st1) vec4 sf2(float param) { .... };
		//subroutine(st1) vec4 sf3(float param) { .... };
		SubroutineFunctionSet functions_st1(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 1) subroutine uniform st0 u0[2];
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 2));

		////layout(location = 3) subroutine uniform st0 u1[2][3];
		std::vector<int> arraySizesSegmented(2);
		arraySizesSegmented[0] = 2;
		arraySizesSegmented[1] = 3;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(3), arraySizesSegmented));

		//layout(location = 9) subroutine uniform st1 u2;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st1, Loc::C(9)));

		return doRun(subroutineUniforms);
	}